

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O2

void __thiscall nonstd::thread_pool::thread_pool(thread_pool *this,int n)

{
  int iVar1;
  
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m).super___mutex_base._M_mutex + 8) = 0;
  (this->m).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->cond);
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_list).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  queue<nonstd::thread_pool::job_info*,std::deque<nonstd::thread_pool::job_info*,std::allocator<nonstd::thread_pool::job_info*>>>
  ::
  queue<std::deque<nonstd::thread_pool::job_info*,std::allocator<nonstd::thread_pool::job_info*>>,void>
            (&this->jobs);
  this->terminate = false;
  iVar1 = 1;
  if (1 < n) {
    iVar1 = n;
  }
  this->MAX_THREADS = iVar1;
  return;
}

Assistant:

thread_pool::thread_pool(int n):MAX_THREADS(n)
    {
        if (MAX_THREADS <= 0) MAX_THREADS = 1;
    }